

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepSetPredictorMethod(void *arkode_mem,int pred_method)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepSetPredictorMethod",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (pred_method == 4) {
      arkProcessError(ark_mem,-0x16,"ARKode::MRIStep","MRIStepSetPredictorMethod",
                      "Predictor option 4 is deprecated, and will be removed in an upcoming release"
                     );
    }
    step_mem->predictor = pred_method;
  }
  return iVar1;
}

Assistant:

int MRIStepSetPredictorMethod(void *arkode_mem, int pred_method)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetPredictorMethod",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Deprecate option 4 */
  if (pred_method == 4) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "MRIStepSetPredictorMethod",
                    "Predictor option 4 is deprecated, and will be removed in an upcoming release");
  }

  /* set parameter */
  step_mem->predictor = pred_method;

  return(ARK_SUCCESS);
}